

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O3

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  InputImageInfo *__ptr;
  bool bVar1;
  uint32_t count;
  InputImageInfo *this_00;
  imageException *this_01;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  bVar1 = AbstractTaskProvider::_ready((AbstractTaskProvider *)this);
  if (!bVar1) {
    this_01 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_01,"FunctionTask object was called multiple times!");
    __cxa_throw(this_01,&imageException::typeinfo,imageException::~imageException);
  }
  this_00 = (InputImageInfo *)operator_new(0x68);
  count = anon_unknown.dwarf_52a2f::threadCount();
  AreaInfo::AreaInfo((AreaInfo *)this_00,x,y,width,height,count);
  this_00->image = image;
  __ptr = (this->_infoIn1)._M_t.
          super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
  (this->_infoIn1)._M_t.
  super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
  .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl = this_00;
  if (__ptr != (InputImageInfo *)0x0) {
    std::default_delete<Function_Pool::InputImageInfo>::operator()
              ((default_delete<Function_Pool::InputImageInfo> *)&this->_infoIn1,__ptr);
    return;
  }
  return;
}

Assistant:

void FunctionPoolTask::_setup( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( image, x, y, width, height, threadCount() ) );
    }